

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Granulator.cpp
# Opt level: O0

void __thiscall
Granulator::Grain::Setup
          (Grain *this,GranulatorSample *_sample,int _channel,Random *random,float sampletime,
          int delaypos,float *params,float startsample,int _wrapping)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float invlength;
  float maxtime;
  float startsample_local;
  float *params_local;
  int delaypos_local;
  float sampletime_local;
  Random *random_local;
  int _channel_local;
  GranulatorSample *_sample_local;
  Grain *this_local;
  
  this->sample = _sample;
  this->channel = _channel;
  this->wrapping = _wrapping;
  fVar2 = (float)(this->sample->numsamples + -1);
  fVar3 = Random::GetFloat(random,params[1],params[1] + params[4]);
  this->length = (int)(fVar2 * fVar3);
  iVar1 = this->length;
  fVar3 = Random::GetFloat(random,params[6] - params[3],params[6]);
  fVar3 = FastClip(fVar3,0.0,1.0);
  this->offset = fVar2 * fVar3 + (float)delaypos;
  fVar2 = Random::GetFloat(random,*params,*params + params[2]);
  fVar2 = FastMax(0.001,fVar2);
  this->speed = fVar2 * (1.0 / (float)iVar1) * (float)this->sample->samplerate * sampletime;
  this->pos = -this->speed * startsample;
  fVar2 = params[9];
  fVar3 = Random::GetFloat(random,-params[10],params[10]);
  this->pan = fVar2 + fVar3;
  this->shape = params[0xb];
  return;
}

Assistant:

inline void Setup(GranulatorSample* _sample, int _channel, Random& random, const float sampletime, const int delaypos, const float* params, float startsample, int _wrapping)
        {
            sample = _sample;
            channel = _channel;
            wrapping = _wrapping;
            float maxtime = sample->numsamples - 1;
            length = (int)(maxtime * random.GetFloat(params[P_WLEN], params[P_WLEN] + params[P_RWLEN]));
            float invlength = 1.0f / (float)length;
            offset = delaypos + maxtime * FastClip(random.GetFloat(params[P_OFFSET] - params[P_ROFS], params[P_OFFSET]), 0.0f, 1.0f);
            speed = FastMax(0.001f, random.GetFloat(params[P_SPEED], params[P_SPEED] + params[P_RSPEED])) * invlength * sample->samplerate * sampletime;
            pos = -speed * startsample;
            pan = params[P_PANBASE] + random.GetFloat(-params[P_PANRANGE], params[P_PANRANGE]);
            shape = params[P_SHAPE];
        }